

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall OIDType::serialise(OIDType *this,uint8_t *buf,size_t max_len)

{
  size_type sVar1;
  uchar *__src;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  OIDType *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,sVar1);
  if (-1 < this_local._4_4_) {
    if ((this->valid & 1U) == 0) {
      this_local._4_4_ = -0x25;
    }
    else {
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      memcpy(buf + this_local._4_4_,__src,sVar1);
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      this_local._4_4_ = ((int)sVar1 + (int)(buf + this_local._4_4_)) - (int)buf;
    }
  }
  return this_local._4_4_;
}

Assistant:

int OIDType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, this->data.size());
    CHECK_ENCODE_ERR(i);
    if(!this->valid) return SNMP_BUFFER_ENCODE_ERROR_INVALID_OID;

    uint8_t* ptr = buf + i;
    memcpy(ptr, this->data.data(), this->data.size());

    ptr += this->data.size();
    return ptr - buf;
}